

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O1

void __thiscall
google::protobuf::io::Tokenizer::ConsumeBlockComment(Tokenizer *this,string *content)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  ErrorCollector *pEVar5;
  ulong uVar6;
  undefined8 uVar7;
  size_type sVar8;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  iVar3 = this->column_;
  if (content != (string *)0x0) {
    this->record_target_ = content;
    this->record_start_ = this->buffer_pos_;
  }
  uVar4 = this->line_;
  do {
    while (bVar1 = this->current_char_, bVar1 < 0x2a) {
      if (bVar1 == 0) goto LAB_002e1eee;
      if (bVar1 == 10) {
        NextChar(this);
        if (content != (string *)0x0) {
          if (this->buffer_pos_ != this->record_start_) {
            std::__cxx11::string::append
                      ((char *)this->record_target_,(ulong)(this->buffer_ + this->record_start_));
          }
          this->record_target_ = (string *)0x0;
          this->record_start_ = -1;
        }
        while (uVar6 = (ulong)(byte)this->current_char_, uVar6 < 0x2b) {
          if ((0x100003a00U >> (uVar6 & 0x3f) & 1) == 0) {
            if ((uVar6 == 0x2a) && (NextChar(this), this->current_char_ == '/')) {
              NextChar(this);
              return;
            }
            break;
          }
          NextChar(this);
        }
        if (content != (string *)0x0) {
          this->record_target_ = content;
          this->record_start_ = this->buffer_pos_;
        }
      }
      else {
LAB_002e1f94:
        NextChar(this);
      }
    }
    if ((bVar1 != 0x2a) && (bVar1 != 0x2f)) goto LAB_002e1f94;
LAB_002e1eee:
    if ((this->current_char_ == '*') && (NextChar(this), this->current_char_ == '/')) {
      NextChar(this);
      if (content == (string *)0x0) {
        return;
      }
      if (this->buffer_pos_ != this->record_start_) {
        std::__cxx11::string::append
                  ((char *)this->record_target_,(ulong)(this->buffer_ + this->record_start_));
      }
      this->record_target_ = (string *)0x0;
      this->record_start_ = -1;
      sVar8 = content->_M_string_length - 2;
      if (1 < content->_M_string_length) {
        content->_M_string_length = sVar8;
        (content->_M_dataplus)._M_p[sVar8] = '\0';
        return;
      }
      uVar7 = std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                         "basic_string::erase");
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      _Unwind_Resume(uVar7);
    }
    cVar2 = this->current_char_;
    if (cVar2 == '/') {
      NextChar(this);
    }
    if (this->current_char_ == '*' && cVar2 == '/') {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"\"/*\" inside block comment.  Block comments cannot be nested."
                 ,"");
      (*this->error_collector_->_vptr_ErrorCollector[2])
                (this->error_collector_,(ulong)(uint)this->line_,(ulong)(uint)this->column_,
                 (string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else if (this->current_char_ == '\0') {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"End-of-file inside block comment.","");
      (*this->error_collector_->_vptr_ErrorCollector[2])
                (this->error_collector_,(ulong)(uint)this->line_,(ulong)(uint)this->column_,local_50
                );
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      pEVar5 = this->error_collector_;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"  Comment started here.","");
      (*pEVar5->_vptr_ErrorCollector[2])(pEVar5,(ulong)uVar4,(ulong)(iVar3 - 2),local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      if (content != (string *)0x0) {
        if (this->buffer_pos_ != this->record_start_) {
          std::__cxx11::string::append
                    ((char *)this->record_target_,(ulong)(this->buffer_ + this->record_start_));
        }
        this->record_target_ = (string *)0x0;
        this->record_start_ = -1;
      }
      return;
    }
  } while( true );
}

Assistant:

void Tokenizer::ConsumeBlockComment(std::string* content) {
  int start_line = line_;
  int start_column = column_ - 2;

  if (content != NULL) RecordTo(content);

  while (true) {
    while (current_char_ != '\0' && current_char_ != '*' &&
           current_char_ != '/' && current_char_ != '\n') {
      NextChar();
    }

    if (TryConsume('\n')) {
      if (content != NULL) StopRecording();

      // Consume leading whitespace and asterisk;
      ConsumeZeroOrMore<WhitespaceNoNewline>();
      if (TryConsume('*')) {
        if (TryConsume('/')) {
          // End of comment.
          break;
        }
      }

      if (content != NULL) RecordTo(content);
    } else if (TryConsume('*') && TryConsume('/')) {
      // End of comment.
      if (content != NULL) {
        StopRecording();
        // Strip trailing "*/".
        content->erase(content->size() - 2);
      }
      break;
    } else if (TryConsume('/') && current_char_ == '*') {
      // Note:  We didn't consume the '*' because if there is a '/' after it
      //   we want to interpret that as the end of the comment.
      AddError(
          "\"/*\" inside block comment.  Block comments cannot be nested.");
    } else if (current_char_ == '\0') {
      AddError("End-of-file inside block comment.");
      error_collector_->AddError(start_line, start_column,
                                 "  Comment started here.");
      if (content != NULL) StopRecording();
      break;
    }
  }
}